

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmMakefile.cxx
# Opt level: O0

bool __thiscall cmMakefile::IsLaterStandard(cmMakefile *this,string *lang,string *lhs,string *rhs)

{
  bool bVar1;
  char **ppcVar2;
  char **ppcVar3;
  cmStrCmp local_d0;
  cmStrCmp local_b0;
  char **local_90;
  char **rhsIt;
  cmStrCmp local_58;
  char **local_38;
  char **rhsIt_1;
  string *rhs_local;
  string *lhs_local;
  string *lang_local;
  cmMakefile *this_local;
  
  rhsIt_1 = (char **)rhs;
  rhs_local = lhs;
  lhs_local = lang;
  lang_local = (string *)this;
  bVar1 = std::operator==(lang,"C");
  if (bVar1) {
    ppcVar2 = cmArrayBegin<char_const*,3ul>(&C_STANDARDS);
    ppcVar3 = cmArrayEnd<char_const*,3ul>(&C_STANDARDS);
    cmStrCmp::cmStrCmp(&local_58,(string *)rhsIt_1);
    ppcVar2 = std::find_if<char_const*const*,cmStrCmp>(ppcVar2,ppcVar3,&local_58);
    cmStrCmp::~cmStrCmp(&local_58);
    local_38 = ppcVar2;
    ppcVar3 = cmArrayEnd<char_const*,3ul>(&C_STANDARDS);
    cmStrCmp::cmStrCmp((cmStrCmp *)&rhsIt,rhs_local);
    ppcVar2 = std::find_if<char_const*const*,cmStrCmp>(ppcVar2,ppcVar3,(cmStrCmp *)&rhsIt);
    ppcVar3 = cmArrayEnd<char_const*,3ul>(&C_STANDARDS);
    this_local._7_1_ = ppcVar2 != ppcVar3;
    cmStrCmp::~cmStrCmp((cmStrCmp *)&rhsIt);
  }
  else {
    ppcVar2 = cmArrayBegin<char_const*,4ul>(&CXX_STANDARDS);
    ppcVar3 = cmArrayEnd<char_const*,4ul>(&CXX_STANDARDS);
    cmStrCmp::cmStrCmp(&local_b0,(string *)rhsIt_1);
    ppcVar2 = std::find_if<char_const*const*,cmStrCmp>(ppcVar2,ppcVar3,&local_b0);
    cmStrCmp::~cmStrCmp(&local_b0);
    local_90 = ppcVar2;
    ppcVar3 = cmArrayEnd<char_const*,4ul>(&CXX_STANDARDS);
    cmStrCmp::cmStrCmp(&local_d0,rhs_local);
    ppcVar2 = std::find_if<char_const*const*,cmStrCmp>(ppcVar2,ppcVar3,&local_d0);
    ppcVar3 = cmArrayEnd<char_const*,4ul>(&CXX_STANDARDS);
    this_local._7_1_ = ppcVar2 != ppcVar3;
    cmStrCmp::~cmStrCmp(&local_d0);
  }
  return (bool)(this_local._7_1_ & 1);
}

Assistant:

bool cmMakefile::IsLaterStandard(std::string const& lang,
                                 std::string const& lhs,
                                 std::string const& rhs)
{
  if (lang == "C") {
    const char* const* rhsIt = std::find_if(
      cmArrayBegin(C_STANDARDS), cmArrayEnd(C_STANDARDS), cmStrCmp(rhs));

    return std::find_if(rhsIt, cmArrayEnd(C_STANDARDS), cmStrCmp(lhs)) !=
      cmArrayEnd(C_STANDARDS);
  }
  const char* const* rhsIt = std::find_if(
    cmArrayBegin(CXX_STANDARDS), cmArrayEnd(CXX_STANDARDS), cmStrCmp(rhs));

  return std::find_if(rhsIt, cmArrayEnd(CXX_STANDARDS), cmStrCmp(lhs)) !=
    cmArrayEnd(CXX_STANDARDS);
}